

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1701:21),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1703:8)>
::getImpl(TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1701:21),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:1703:8)>
          *this,ExceptionOrValue *output)

{
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  long *plVar1;
  Exception *params_2;
  DebugComparison<kj::StringPtr,_const_char_(&)[12]> _kjCondition;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
  depResult;
  DebugExpression<kj::StringPtr> local_3d8;
  DebugComparison<kj::StringPtr,_const_char_(&)[12]> local_3c8;
  ExceptionOrValue local_398;
  char local_200;
  undefined8 *local_1c8;
  long *local_1c0;
  ExceptionOr<kj::_::Void> local_1b8;
  
  local_398.exception.ptr.isSet = false;
  local_200 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_398);
  this_00 = &local_398.exception.ptr.field_1;
  params_2 = (Exception *)0x0;
  if (local_398.exception.ptr.isSet != false) {
    params_2 = (Exception *)this_00;
  }
  if (local_398.exception.ptr.isSet == true) {
    if (local_398.exception.ptr.field_1.value.description.content.size_ == 0) {
      local_398.exception.ptr.field_1.value.description.content.ptr = "";
    }
    local_3d8.value.content.size_ =
         local_398.exception.ptr.field_1.value.description.content.size_ +
         (local_398.exception.ptr.field_1.value.description.content.size_ == 0);
    local_3d8.value.content.ptr = local_398.exception.ptr.field_1.value.description.content.ptr;
    DebugExpression<kj::StringPtr>::operator==(&local_3c8,&local_3d8,(char (*) [12])"intercepted");
    if ((local_3c8.result == false) && (Debug::minSeverity < 3)) {
      Debug::
      log<char_const(&)[53],kj::_::DebugComparison<kj::StringPtr,char_const(&)[12]>&,kj::Exception&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x6a8,ERROR,
                 "\"failed: expected \" \"e.getDescription() == \\\"intercepted\\\"\", _kjCondition, e"
                 ,(char (*) [53])"failed: expected e.getDescription() == \"intercepted\"",&local_3c8
                 ,params_2);
    }
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b8);
    if (local_1b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
  }
  else if (local_200 == '\x01') {
    Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x6a6,FAILED,(char *)0x0,"\"should have thrown\"",(char (*) [19])0x5009fe);
    Debug::Fault::fatal((Fault *)&local_1b8);
  }
  plVar1 = local_1c0;
  if ((local_200 == '\x01') && (local_1c0 != (long *)0x0)) {
    local_1c0 = (long *)0x0;
    (**(code **)*local_1c8)(local_1c8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  if (local_398.exception.ptr.isSet == true) {
    Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }